

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O0

bool __thiscall units::precise_unit::operator==(precise_unit *this,precise_unit *other)

{
  bool bVar1;
  precise_unit *other_local;
  precise_unit *this_local;
  
  bVar1 = detail::unit_data::operator!=(&this->base_units_,&other->base_units_);
  if ((bVar1) || (this->commodity_ != other->commodity_)) {
    this_local._7_1_ = false;
  }
  else if ((this->multiplier_ != other->multiplier_) ||
          (NAN(this->multiplier_) || NAN(other->multiplier_))) {
    this_local._7_1_ = detail::compare_round_equals_precise(this->multiplier_,other->multiplier_);
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool operator==(const precise_unit& other) const
    {
        if (base_units_ != other.base_units_ ||
            commodity_ != other.commodity_) {
            return false;
        }
        if (multiplier_ == other.multiplier_) {
            return true;
        }
        return detail::compare_round_equals_precise(
            multiplier_, other.multiplier_);
    }